

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_(unsigned_int,_unsigned_int)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3147:19)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3147:19)>
             *this,uint params,uint params_1)

{
  RemoveConst<CallbackEvent> **ppRVar1;
  Vector<CallbackEvent> *pVVar2;
  RemoveConst<CallbackEvent> *pRVar3;
  RemoveConst<CallbackEvent> *pRVar4;
  RemoveConst<CallbackEvent> *pRVar5;
  CallbackEvent *pCVar6;
  CallbackEvent *pCVar7;
  ArrayDisposer *pAVar8;
  CallbackEvent *__dest;
  RemoveConst<CallbackEvent> RVar9;
  ulong capacity;
  size_t __n;
  
  pVVar2 = (this->f).callbackEvents;
  pRVar3 = (pVVar2->builder).pos;
  pRVar4 = (pVVar2->builder).endPtr;
  if (pRVar3 == pRVar4) {
    pRVar5 = (pVVar2->builder).ptr;
    capacity = 4;
    if (pRVar4 != pRVar5) {
      capacity = (long)pRVar4 - (long)pRVar5 >> 2;
    }
    if (capacity < (ulong)((long)pRVar3 - (long)pRVar5 >> 3)) {
      (pVVar2->builder).pos = pRVar5 + capacity;
    }
    __dest = (CallbackEvent *)
             _::HeapArrayDisposer::allocateImpl
                       (8,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pCVar6 = (pVVar2->builder).ptr;
    __n = (long)(pVVar2->builder).pos - (long)pCVar6;
    if (__n != 0) {
      memcpy(__dest,pCVar6,__n);
    }
    pCVar6 = (pVVar2->builder).ptr;
    if (pCVar6 != (CallbackEvent *)0x0) {
      pRVar3 = (pVVar2->builder).pos;
      pCVar7 = (pVVar2->builder).endPtr;
      (pVVar2->builder).ptr = (CallbackEvent *)0x0;
      (pVVar2->builder).pos = (RemoveConst<CallbackEvent> *)0x0;
      (pVVar2->builder).endPtr = (CallbackEvent *)0x0;
      pAVar8 = (pVVar2->builder).disposer;
      (**pAVar8->_vptr_ArrayDisposer)
                (pAVar8,pCVar6,8,(long)pRVar3 - (long)pCVar6 >> 3,(long)pCVar7 - (long)pCVar6 >> 3,0
                );
    }
    (pVVar2->builder).ptr = __dest;
    (pVVar2->builder).pos = (RemoveConst<CallbackEvent> *)((long)__dest + __n);
    (pVVar2->builder).endPtr = __dest + capacity;
    (pVVar2->builder).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  }
  RVar9.pendingCount = params_1;
  RVar9.runningCount = params;
  *(pVVar2->builder).pos = RVar9;
  ppRVar1 = &(pVVar2->builder).pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }